

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ImplicationConstraint * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ImplicationConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&>
          (BumpAllocator *this,Expression *args,Constraint *args_1)

{
  ImplicationConstraint *pIVar1;
  
  pIVar1 = (ImplicationConstraint *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImplicationConstraint *)this->endPtr < pIVar1 + 1) {
    pIVar1 = (ImplicationConstraint *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pIVar1 + 1);
  }
  (pIVar1->super_Constraint).kind = Implication;
  (pIVar1->super_Constraint).syntax = (ConstraintItemSyntax *)0x0;
  pIVar1->predicate = args;
  pIVar1->body = args_1;
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }